

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

shared_ptr<mcc::While> __thiscall mcc::Parser::WhileStatement(Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TokenType in_ESI;
  shared_ptr<mcc::While> sVar1;
  allocator<char> local_71;
  shared_ptr<mcc::Stmt> loop_block;
  shared_ptr<mcc::Expr> condition;
  shared_ptr<mcc::Token> while_token;
  undefined1 local_30 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  Consume((Parser *)&while_token,in_ESI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&loop_block,"Expected \'(\' after \'while\'",(allocator<char> *)&condition);
  Consume((Parser *)(local_30 + 0x10),in_ESI,(string *)0x1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  std::__cxx11::string::~string((string *)&loop_block);
  Expression((Parser *)&condition,in_ESI);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&loop_block,"Expected \')\' after \'while\' condition",&local_71);
  Consume((Parser *)local_30,in_ESI,(string *)0x2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_30 + 8));
  std::__cxx11::string::~string((string *)&loop_block);
  Statement((Parser *)&loop_block);
  DisallowDecl(&loop_block,&while_token);
  local_71 = (allocator<char>)0x0;
  std::
  make_shared<mcc::While,std::shared_ptr<mcc::Token>&,std::shared_ptr<mcc::Expr>&,std::shared_ptr<mcc::Stmt>&,bool>
            ((shared_ptr<mcc::Token> *)this,(shared_ptr<mcc::Expr> *)&while_token,
             (shared_ptr<mcc::Stmt> *)&condition,(bool *)&loop_block);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&loop_block.super___shared_ptr<mcc::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&condition.super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&while_token.super___shared_ptr<mcc::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  sVar1.super___shared_ptr<mcc::While,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<mcc::While,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<mcc::While>)sVar1.super___shared_ptr<mcc::While,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<While> Parser::WhileStatement() {
  std::shared_ptr<Token> while_token = Consume(TokenType::T_WHILE);
  Consume(TokenType::T_LPAREN, "Expected '(' after 'while'");
  std::shared_ptr<Expr> condition = Expression(0);
  Consume(TokenType::T_RPAREN, "Expected ')' after 'while' condition");
  std::shared_ptr<Stmt> loop_block = Statement();
  DisallowDecl(loop_block, while_token);
  return std::make_shared<While>(while_token, condition, loop_block, false);
}